

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionSlerp(Quaternion q1,Quaternion q2,float amount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Quaternion QVar12;
  Quaternion QVar13;
  
  fVar7 = q2.z;
  fVar8 = q2.w;
  fVar5 = q2.x;
  fVar6 = q2.y;
  fVar3 = q1.z;
  fVar4 = q1.w;
  fVar9 = q1.x;
  fVar10 = q1.y;
  fVar11 = fVar8 * fVar4 + fVar3 * fVar7 + fVar9 * fVar5 + fVar10 * fVar6;
  if (fVar11 < -fVar11) {
    fVar5 = -fVar5;
    fVar6 = -fVar6;
    fVar7 = -fVar7;
    fVar8 = -fVar8;
    fVar11 = -fVar11;
  }
  if (ABS(fVar11) < 1.0) {
    if (fVar11 <= 0.95) {
      fVar1 = acosf(fVar11);
      fVar11 = 1.0 - fVar11 * fVar11;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      if (1e-06 <= ABS(fVar11)) {
        fVar2 = sinf((1.0 - amount) * fVar1);
        fVar2 = fVar2 / fVar11;
        fVar1 = sinf(fVar1 * amount);
        fVar1 = fVar1 / fVar11;
        fVar9 = fVar9 * fVar2 + fVar5 * fVar1;
        fVar10 = fVar10 * fVar2 + fVar6 * fVar1;
        fVar3 = fVar3 * fVar2;
        fVar4 = fVar4 * fVar2;
      }
      else {
        fVar1 = 0.5;
        fVar9 = fVar9 * 0.5 + fVar5 * 0.5;
        fVar10 = fVar10 * 0.5 + fVar6 * 0.5;
        fVar3 = fVar3 * 0.5;
        fVar4 = fVar4 * 0.5;
      }
      fVar3 = fVar3 + fVar7 * fVar1;
      fVar4 = fVar4 + fVar8 * fVar1;
    }
    else {
      QVar12.y = fVar6;
      QVar12.x = fVar5;
      QVar12.w = fVar8;
      QVar12.z = fVar7;
      QVar12 = QuaternionNlerp(q1,QVar12,amount);
      fVar3 = QVar12.z;
      fVar4 = QVar12.w;
      fVar9 = QVar12.x;
      fVar10 = QVar12.y;
    }
  }
  QVar13.y = fVar10;
  QVar13.x = fVar9;
  QVar13.w = fVar4;
  QVar13.z = fVar3;
  return QVar13;
}

Assistant:

RMAPI Quaternion QuaternionSlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    float cosHalfTheta = q1.x*q2.x + q1.y*q2.y + q1.z*q2.z + q1.w*q2.w;

    if (cosHalfTheta < 0)
    {
        q2.x = -q2.x; q2.y = -q2.y; q2.z = -q2.z; q2.w = -q2.w;
        cosHalfTheta = -cosHalfTheta;
    }

    if (fabsf(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = QuaternionNlerp(q1, q2, amount);
    else
    {
        float halfTheta = acosf(cosHalfTheta);
        float sinHalfTheta = sqrtf(1.0f - cosHalfTheta*cosHalfTheta);

        if (fabsf(sinHalfTheta) < EPSILON)
        {
            result.x = (q1.x*0.5f + q2.x*0.5f);
            result.y = (q1.y*0.5f + q2.y*0.5f);
            result.z = (q1.z*0.5f + q2.z*0.5f);
            result.w = (q1.w*0.5f + q2.w*0.5f);
        }
        else
        {
            float ratioA = sinf((1 - amount)*halfTheta)/sinHalfTheta;
            float ratioB = sinf(amount*halfTheta)/sinHalfTheta;

            result.x = (q1.x*ratioA + q2.x*ratioB);
            result.y = (q1.y*ratioA + q2.y*ratioB);
            result.z = (q1.z*ratioA + q2.z*ratioB);
            result.w = (q1.w*ratioA + q2.w*ratioB);
        }
    }

    return result;
}